

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_number.cpp
# Opt level: O2

int tagFUNCTION::CompareFunctionName(wchar_t *a,int a_count,wchar_t *b)

{
  wchar_t wVar1;
  ulong uVar2;
  ulong uVar3;
  wchar_t wVar4;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)a_count;
  if (a_count < 1) {
    uVar3 = uVar2;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      if (L'\0' < b[uVar2]) {
        return -1;
      }
      return (int)(b[uVar2] != L'\0');
    }
    wVar1 = a[uVar2];
    wVar4 = wVar1 | 0x20;
    if (0x19 < (uint)(wVar1 + L'\xffffffbf')) {
      wVar4 = wVar1;
    }
    if (wVar4 < b[uVar2]) break;
    if (b[uVar2] < wVar4) {
      return 1;
    }
    uVar2 = uVar2 + 1;
    if (wVar4 == L'\0') {
      return 0;
    }
  }
  return -1;
}

Assistant:

static int CompareFunctionName(
    const wchar_t* a,
    int a_count,
    const wchar_t* b
    )
  {
    wchar_t c, d=0;
    for ( int a_index = 0; a_index < a_count; a_index++ )
    {
      c = a[a_index];
      d = *b++;
      if ( c >= 'A' && c <= 'Z' )
        c += 'a'-'A';
      if ( c < d )
        return -1;
      if ( c > d )
        return 1;
      if ( 0 == c )
        return 0;
    }
    d = *b++;
    if ( 0 < d )
      return -1;
    if ( 0 > d )
      return 1;
    return 0;
  }